

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

int Div_AddLit(int Lit,int *pLits)

{
  int *pLits_local;
  int Lit_local;
  
  if (*pLits == -1) {
    *pLits = Lit;
  }
  else {
    if (pLits[1] != -1) {
      return 1;
    }
    pLits[1] = Lit;
  }
  return 0;
}

Assistant:

static inline int Div_AddLit( int Lit, int pLits[2] )
{
    if ( pLits[0] == -1 )
        pLits[0] = Lit;
    else if ( pLits[1] == -1 )
        pLits[1] = Lit;
    else return 1;
    return 0;
}